

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O2

void __thiscall Js::ScriptContextProfiler::~ScriptContextProfiler(ScriptContextProfiler *this)

{
  if (this->profilerArena != (ArenaAllocator *)0x0) {
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::ArenaAllocator>
              (&Memory::HeapAllocator::Instance,this->profilerArena);
  }
  if ((this->recycler != (Recycler *)0x0) &&
     (this->backgroundRecyclerProfilerArena != (ArenaAllocator *)0x0)) {
    (**((this->backgroundRecyclerProfilerArena->
        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>).super_ArenaData.
       pageAllocator)->_vptr_PageAllocatorBase)();
    Memory::Recycler::ReleaseBackgroundProfilerArena
              (this->recycler,this->backgroundRecyclerProfilerArena);
  }
  return;
}

Assistant:

ScriptContextProfiler::~ScriptContextProfiler()
    {
        if (profilerArena)
        {
            HeapDelete(profilerArena);
        }

        if (recycler && backgroundRecyclerProfilerArena)
        {
#if DBG
            //We are freeing from main thread, disable thread check assert.
            backgroundRecyclerProfilerArena->GetPageAllocator()->SetDisableThreadAccessCheck();
#endif
            recycler->ReleaseBackgroundProfilerArena(backgroundRecyclerProfilerArena);
        }
    }